

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O0

SMatrix<double,_3,_3> * gmath::operator*(double s,SMatrix<double,_3,_3> *a)

{
  double *pdVar1;
  SMatrix<double,_3,_3> *in_RSI;
  SMatrix<double,_3,_3> *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  int i;
  int k;
  SMatrix<double,_3,_3> *ret;
  undefined4 local_20;
  undefined4 local_1c;
  
  SMatrix<double,_3,_3>::SMatrix(in_RDI);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      dVar2 = SMatrix<double,_3,_3>::operator()(in_RSI,local_1c,local_20);
      pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,local_1c,local_20);
      *pdVar1 = in_XMM0_Qa * dVar2;
    }
  }
  return in_RDI;
}

Assistant:

inline SMatrix<T, nrows, ncols> operator*(S s,
    const SMatrix<T, nrows, ncols> &a)
{
  SMatrix<T, nrows, ncols> ret;

  for (int k=0; k<nrows; k++)
    for (int i=0; i<ncols; i++)
    {
      ret(k, i)=s*a(k, i);
    }

  return ret;
}